

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O3

void __thiscall bidirectional::BiDirectional::initContainers(BiDirectional *this)

{
  Directions DVar1;
  _Head_base<0UL,_bidirectional::Search_*,_false> this_00;
  
  DVar1 = ((this->params_ptr_)._M_t.
           super___uniq_ptr_impl<bidirectional::Params,_std::default_delete<bidirectional::Params>_>
           ._M_t.
           super__Tuple_impl<0UL,_bidirectional::Params_*,_std::default_delete<bidirectional::Params>_>
           .super__Head_base<0UL,_bidirectional::Params_*,_false>._M_head_impl)->direction;
  if (DVar1 == BOTH) {
    Search::makeHeap((this->fwd_search_ptr_)._M_t.
                     super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
                     .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl);
    this_00._M_head_impl =
         (this->bwd_search_ptr_)._M_t.
         super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>.
         _M_t.
         super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
         .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl;
  }
  else {
    this_00._M_head_impl =
         (&this->fwd_search_ptr_)[DVar1 != FWD]._M_t.
         super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>.
         _M_t.
         super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
         .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl;
  }
  Search::makeHeap(this_00._M_head_impl);
  return;
}

Assistant:

void BiDirectional::initContainers() {
  if (params_ptr_->direction != BOTH) {
    Search* search_ptr = getSearchPtr(params_ptr_->direction);
    search_ptr->makeHeap();
  } else {
    fwd_search_ptr_->makeHeap();
    bwd_search_ptr_->makeHeap();
  }
}